

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2gal.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  CEDate *date_00;
  CEDate *this;
  CESkyCoord gal_coords;
  CESkyCoord obs_coords;
  CEDate date;
  CEObserver observer;
  CEExecOptions opts;
  CEExecOptions *in_stack_fffffffffffff9b0;
  CLOptions *in_stack_fffffffffffff9b8;
  CLOptions *this_00;
  undefined8 in_stack_fffffffffffff9c0;
  CEDateType date_format;
  double in_stack_fffffffffffff9c8;
  allocator *paVar2;
  CEObserver *observer_00;
  CEAngleType *in_stack_fffffffffffff9e0;
  double *in_stack_fffffffffffff9e8;
  CESkyCoord *this_01;
  double *in_stack_fffffffffffff9f0;
  double *in_stack_fffffffffffff9f8;
  CEObserver *in_stack_fffffffffffffa00;
  allocator<char> local_569;
  string local_568 [32];
  CEExecOptions *local_548;
  allocator local_529;
  string local_528 [32];
  double local_508;
  undefined1 local_4b9 [104];
  undefined1 local_451 [33];
  CEDate *local_430;
  allocator local_421;
  string local_420 [32];
  double local_400;
  allocator local_3f1;
  string local_3f0 [32];
  double local_3d0;
  allocator local_3c1;
  string local_3c0 [32];
  double local_3a0;
  undefined4 local_398;
  allocator local_391;
  string local_390 [32];
  double local_370;
  allocator local_361;
  string local_360 [8];
  char **in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcb4;
  CLOptions *in_stack_fffffffffffffcb8;
  allocator local_331;
  string local_330 [32];
  double local_310;
  CESkyCoord *in_stack_fffffffffffffd18;
  CEExecOptions *in_stack_fffffffffffffd20;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffff9c0 >> 0x20);
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_330,"longitude",&local_331);
    local_310 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"latitude",&local_361);
    CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"elevation",&local_391);
    local_370 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    local_398 = 0;
    CEObserver::CEObserver
              (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
               in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::__cxx11::string::~string(local_330);
    std::allocator<char>::~allocator((allocator<char> *)&local_331);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3c0,"pressure",&local_3c1);
    local_3a0 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEObserver::SetPressure_hPa((CEObserver *)&stack0xfffffffffffffcf8,&local_3a0);
    std::__cxx11::string::~string(local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f0,"temperature",&local_3f1);
    local_3d0 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEObserver::SetTemperature_C((CEObserver *)&stack0xfffffffffffffcf8,&local_3d0);
    std::__cxx11::string::~string(local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    paVar2 = &local_421;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_420,"humidity",paVar2);
    local_400 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEObserver::SetRelativeHumidity((CEObserver *)&stack0xfffffffffffffcf8,&local_400);
    std::__cxx11::string::~string(local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    this_01 = (CESkyCoord *)local_451;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_451 + 1),"wavelength",(allocator *)this_01);
    date_00 = (CEDate *)
              CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    local_430 = date_00;
    CEObserver::SetWavelength_um((CEObserver *)&stack0xfffffffffffffcf8,(double *)&local_430);
    std::__cxx11::string::~string((string *)(local_451 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_451);
    observer_00 = (CEObserver *)local_4b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_4b9 + 1),"juliandate",(allocator *)observer_00);
    this = (CEDate *)
           CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEDate::CEDate(this,in_stack_fffffffffffff9c8,date_format);
    std::__cxx11::string::~string((string *)(local_4b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4b9);
    paVar2 = &local_529;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"azimuth",paVar2);
    local_508 = CLOptions::AsDouble(in_stack_fffffffffffff9b8,(string *)in_stack_fffffffffffff9b0);
    CEAngle::Deg((double *)this_01);
    this_00 = (CLOptions *)&local_569;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"zenith",(allocator *)this_00);
    in_stack_fffffffffffff9b0 =
         (CEExecOptions *)CLOptions::AsDouble(this_00,(string *)in_stack_fffffffffffff9b0);
    local_548 = in_stack_fffffffffffff9b0;
    CEAngle::Deg((double *)this_01);
    CESkyCoord::CESkyCoord
              ((CESkyCoord *)date_00,(CEAngle *)observer_00,(CEAngle *)this,(CESkyCoordType *)paVar2
              );
    CEAngle::~CEAngle((CEAngle *)0x13800f);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator(&local_569);
    CEAngle::~CEAngle((CEAngle *)0x138036);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    CESkyCoord::ConvertToGalactic(this_01,date_00,observer_00);
    PrintResults(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    CESkyCoord::~CESkyCoord((CESkyCoord *)in_stack_fffffffffffff9b0);
    CESkyCoord::~CESkyCoord((CESkyCoord *)in_stack_fffffffffffff9b0);
    CEDate::~CEDate((CEDate *)0x1380cb);
    CEObserver::~CEObserver((CEObserver *)in_stack_fffffffffffff9b0);
  }
  CEExecOptions::~CEExecOptions(in_stack_fffffffffffff9b0);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    
    // Parse the command line options
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Define the observer
    CEObserver observer(opts.AsDouble("longitude"),
                        opts.AsDouble("latitude"),
                        opts.AsDouble("elevation"),
                        CEAngleType::DEGREES);
    observer.SetPressure_hPa(opts.AsDouble("pressure"));
    observer.SetTemperature_C(opts.AsDouble("temperature"));
    observer.SetRelativeHumidity(opts.AsDouble("humidity"));
    observer.SetWavelength_um(opts.AsDouble("wavelength"));

    // Define the date
    CEDate date(opts.AsDouble("juliandate"), CEDateType::JD);

    // Convert the coordinates
    CESkyCoord obs_coords(CEAngle::Deg(opts.AsDouble("azimuth")),
                          CEAngle::Deg(opts.AsDouble("zenith")),
                          CESkyCoordType::OBSERVED);
    CESkyCoord gal_coords = obs_coords.ConvertToGalactic(date, observer);
    
    // Print the results
    PrintResults(opts, gal_coords);
    
    return 0;
}